

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

bool __thiscall Memory::Recycler::DumpObjectGraph(Recycler *this,Param *param)

{
  ObservableValue<Memory::CollectionState> *pOVar1;
  CollectionState CVar2;
  ObservableValueObserver<Memory::CollectionState> *pOVar3;
  byte bVar4;
  char16_t *form;
  undefined1 local_7c8 [8];
  RecyclerObjectGraphDumper objectGraphDumper;
  AutoSetupRecyclerForNonCollectingMark AutoSetupRecyclerForNonCollectingMark;
  AutoRestoreValue<bool> skipStackToggle;
  DebugCheckNoException __debugCheckNoException;
  
  pOVar1 = &this->collectionState;
  CVar2 = (this->collectionState).value;
  if (CVar2 == CollectionStateExit) {
    objectGraphDumper.dumpObjectIsArray = false;
    objectGraphDumper.isOutOfMemory = false;
    objectGraphDumper._554_2_ = 0;
    pOVar3 = (this->collectionState).observer;
    if (pOVar3 != (ObservableValueObserver<Memory::CollectionState> *)0x0) {
      (**pOVar3->_vptr_ObservableValueObserver)(pOVar3,&objectGraphDumper.dumpObjectIsArray,pOVar1);
    }
    pOVar1->value = objectGraphDumper._552_4_;
  }
  if (pOVar1->value == CollectionStateNotCollecting) {
    skipStackToggle._20_1_ = 1;
    skipStackToggle._16_4_ = ExceptionCheck::Save();
    RecyclerObjectGraphDumper::RecyclerObjectGraphDumper
              ((RecyclerObjectGraphDumper *)local_7c8,this,param);
    Recycler::AutoSetupRecyclerForNonCollectingMark::AutoSetupRecyclerForNonCollectingMark
              ((AutoSetupRecyclerForNonCollectingMark *)&objectGraphDumper.dumpObjectIsArray,this,
               false);
    skipStackToggle._0_8_ = &this->skipStack;
    skipStackToggle.variable._0_1_ = this->skipStack;
    AutoSetupRecyclerForNonCollectingMark.m_previousCollectionStats.numEmptySmallBlocks[10]._0_1_ =
         true;
    if ((bool)(char)skipStackToggle.variable == false) {
      if (param == (Param *)0x0) {
        AutoSetupRecyclerForNonCollectingMark.m_previousCollectionStats.numEmptySmallBlocks[10].
        _0_1_ = false;
      }
      else {
        AutoSetupRecyclerForNonCollectingMark.m_previousCollectionStats.numEmptySmallBlocks[10].
        _0_1_ = param->skipStack;
      }
    }
    this->skipStack =
         (bool)(undefined1)
               AutoSetupRecyclerForNonCollectingMark.m_previousCollectionStats.numEmptySmallBlocks
               [10];
    Mark(this);
    this->objectGraphDumper = (RecyclerObjectGraphDumper *)0x0;
    if (param != (Param *)0x0) {
      memcpy(&param->stats,&this->collectionStats,0x538);
    }
    AutoRestoreValue<bool>::~AutoRestoreValue
              ((AutoRestoreValue<bool> *)
               (AutoSetupRecyclerForNonCollectingMark.m_previousCollectionStats.numEmptySmallBlocks
               + 10));
    Recycler::AutoSetupRecyclerForNonCollectingMark::~AutoSetupRecyclerForNonCollectingMark
              ((AutoSetupRecyclerForNonCollectingMark *)&objectGraphDumper.dumpObjectIsArray);
    RecyclerObjectGraphDumper::~RecyclerObjectGraphDumper((RecyclerObjectGraphDumper *)local_7c8);
    skipStackToggle._20_1_ = 0;
    DebugCheckNoException::~DebugCheckNoException
              ((DebugCheckNoException *)&skipStackToggle.oldValue);
    if (CVar2 == CollectionStateExit) {
      objectGraphDumper.dumpObjectIsArray = true;
      objectGraphDumper.isOutOfMemory = false;
      objectGraphDumper._554_2_ = 0;
      pOVar3 = (this->collectionState).observer;
      if ((pOVar3 != (ObservableValueObserver<Memory::CollectionState> *)0x0) &&
         ((this->collectionState).value != CollectionStateExit)) {
        (**pOVar3->_vptr_ObservableValueObserver)
                  (pOVar3,&objectGraphDumper.dumpObjectIsArray,pOVar1);
      }
      pOVar1->value = objectGraphDumper._552_4_;
    }
    bVar4 = objectGraphDumper.dumpObjectTypeInfo._1_1_ ^ 1;
    if (objectGraphDumper.dumpObjectTypeInfo._1_1_ == 0) goto LAB_00714066;
    form = L"Out of memory dumping object graph\n";
  }
  else {
    form = L"Can\'t dump object graph when collecting\n";
    bVar4 = 0;
  }
  Output::Print(form);
LAB_00714066:
  Output::Flush();
  return (bool)bVar4;
}

Assistant:

bool Recycler::DumpObjectGraph(RecyclerObjectGraphDumper::Param * param)
{
    bool succeeded = false;
    bool isExited = (this->collectionState == CollectionStateExit);
    if (isExited)
    {
        this->SetCollectionState(CollectionStateNotCollecting);
    }
    if (this->collectionState != CollectionStateNotCollecting)
    {
        Output::Print(_u("Can't dump object graph when collecting\n"));
        Output::Flush();
        return succeeded;
    }
    BEGIN_NO_EXCEPTION
    {
        RecyclerObjectGraphDumper objectGraphDumper(this, param);

        Recycler::AutoSetupRecyclerForNonCollectingMark AutoSetupRecyclerForNonCollectingMark(*this);
        AutoRestoreValue<bool> skipStackToggle(&this->skipStack, this->skipStack || (param && param->skipStack));

        this->Mark();

        this->objectGraphDumper = nullptr;
#ifdef RECYCLER_STATS
        if (param)
        {
            param->stats = this->collectionStats;
        }
#endif
        succeeded = !objectGraphDumper.isOutOfMemory;
    }